

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair_mb.cpp
# Opt level: O1

void __thiscall
embree::sse2::
BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::build
          (BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<4>,_embree::LineMi<4>,_embree::PointMi<4>_>
           *this)

{
  size_t *psVar1;
  BVHN<4> *this_00;
  Scene *pSVar2;
  Allocator alloc;
  long *plVar3;
  ulong uVar4;
  size_t *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  size_t sVar8;
  anon_class_8_1_8991fb9c createLeaf;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  Set local_2ec;
  Create local_2eb;
  Set local_2ea;
  Create local_2e9;
  mvector<PrimRefMB> local_2e8;
  double local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  CreateAlloc local_298;
  anon_class_8_1_8991fb9c local_290;
  VirtualRecalculatePrimRef local_288;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_278;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  ulong local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_mb_cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
  local_1e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  mvector<PrimRefMB> *local_a8;
  NodeRecordMB4D local_98;
  
  this_00 = this->bvh;
  pSVar2 = this->scene;
  sVar8 = (pSVar2->world).numMBBezierCurves + (pSVar2->world).numMBLineSegments +
          (pSVar2->world).numMBPoints;
  if (sVar8 == 0) {
    local_148._0_8_ = 0x7f8000007f800000;
    local_148._8_8_ = 0x7f8000007f800000;
    local_138._M_allocated_capacity = 0xff800000ff800000;
    local_138._8_8_ = 0xff800000ff800000;
    local_128 = 0x7f8000007f800000;
    uStack_120 = 0x7f8000007f800000;
    local_118 = 0xff800000ff800000;
    uStack_110 = 0xff800000ff800000;
    BVHN<4>::set(this_00,(NodeRef)0x8,(LBBox3fa *)&local_148.field_1,0);
  }
  else {
    local_278._0_8_ = &local_268;
    std::__cxx11::string::_M_construct((ulong)&local_278,'\x01');
    *(undefined1 *)local_278._0_8_ = 0x34;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x1ffdf3e);
    psVar1 = &local_1e0.cfg.logBlockSize;
    psVar5 = (size_t *)(plVar3 + 2);
    if ((size_t *)*plVar3 == psVar5) {
      local_1e0.cfg.logBlockSize = *psVar5;
      local_1e0.cfg.minLeafSize = plVar3[3];
      local_1e0.cfg.branchingFactor = (size_t)psVar1;
    }
    else {
      local_1e0.cfg.logBlockSize = *psVar5;
      local_1e0.cfg.branchingFactor = (size_t)*plVar3;
    }
    local_1e0.cfg.maxDepth = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar6) {
      local_138._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_138._8_8_ = plVar3[3];
      local_148._0_8_ = &local_138;
    }
    else {
      local_138._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar3;
    }
    local_148._8_8_ = plVar3[1];
    *plVar3 = (long)paVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_2c0 = BVHN<4>::preBuild(this_00,(string *)&local_148.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ != &local_138) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((size_t *)local_1e0.cfg.branchingFactor != psVar1) {
      operator_delete((void *)local_1e0.cfg.branchingFactor);
    }
    if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_278._0_8_ != &local_268) {
      operator_delete((void *)local_278._0_8_);
    }
    lVar7 = *(long *)&(this->scene->super_AccelN).field_0x188;
    local_2e8.alloc.device = (MemoryMonitorInterface *)(lVar7 + 0x550);
    if (lVar7 == 0) {
      local_2e8.alloc.device = (MemoryMonitorInterface *)0x0;
    }
    local_2e8.alloc.hugepages = false;
    uVar4 = sVar8 * 0x50;
    local_2e8.size_active = 0;
    local_2e8.size_alloced = 0;
    local_2e8.items = (PrimRefMB *)0x0;
    (**(local_2e8.alloc.device)->_vptr_MemoryMonitorInterface)(local_2e8.alloc.device,uVar4,0);
    if (uVar4 < 0x1c00000) {
      local_2e8.items = (PrimRefMB *)alignedMalloc(uVar4,0x10);
    }
    else {
      local_2e8.items = (PrimRefMB *)os_malloc(uVar4,&local_2e8.alloc.hugepages);
    }
    local_2e8.size_active = sVar8;
    local_2e8.size_alloced = sVar8;
    createPrimRefArrayMSMBlur
              ((PrimInfoMB *)&local_278.field_1,this->scene,MTY_CURVES,sVar8,&local_2e8,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
               (BBox1f)0x3f80000000000000);
    uVar4 = (ulong)((uint)local_208 & 3);
    lVar7 = uVar4 * 0x25 + 0x1e;
    if (uVar4 == 0) {
      lVar7 = 0;
    }
    FastAllocator::init_estimate
              (&this->bvh->alloc,(local_208 >> 2) * 0xb2 + (local_208 * 0xe0 >> 4) + lVar7);
    for (local_1e0.cfg.logBlockSize = 0; (4UL >> local_1e0.cfg.logBlockSize & 1) == 0;
        local_1e0.cfg.logBlockSize = local_1e0.cfg.logBlockSize + 1) {
    }
    local_1e0.createLeaf = &local_290;
    local_288.scene = this->scene;
    local_1e0.recalculatePrimRef = &local_288;
    local_288.sgrids = (SubGridBuildData *)0x0;
    local_298.super_Create.allocator = (Create)&this->bvh->alloc;
    local_1e0.createAlloc = &local_298;
    local_1e0.progressMonitor = &this->bvh->scene->progressInterface;
    local_1e0.cfg.branchingFactor = 4;
    local_1e0.cfg.maxDepth = 0x28;
    local_1e0.cfg.minLeafSize = 4;
    local_1e0.cfg.maxLeafSize = 4;
    local_1e0.createAABBNodeMB = &local_2e9;
    local_1e0.setAABBNodeMB = &local_2ea;
    local_1e0.createOBBNodeMB = &local_2eb;
    local_1e0.setOBBNodeMB = &local_2ec;
    lVar7 = *(long *)&((local_288.scene)->super_AccelN).field_0x188;
    local_1e0.temporalSplitHeuristic.device = (MemoryMonitorInterface *)(lVar7 + 0x550);
    if (lVar7 == 0) {
      local_1e0.temporalSplitHeuristic.device = (MemoryMonitorInterface *)0x0;
    }
    local_1e0.temporalSplitHeuristic.recalculatePrimRef.sgrids = (SubGridBuildData *)0x0;
    local_c8 = local_208;
    uStack_c0 = uStack_200;
    local_b8 = local_1f8;
    uStack_b0 = uStack_1f0;
    local_148._0_8_ = 1;
    local_138._M_allocated_capacity = local_278._0_8_;
    local_138._8_8_ = local_278._8_8_;
    local_128 = local_268._0_8_;
    uStack_120 = local_268._8_8_;
    local_118 = local_258;
    uStack_110 = uStack_250;
    local_108 = local_248;
    uStack_100 = uStack_240;
    local_f8 = local_238;
    uStack_f0 = uStack_230;
    local_e8 = local_228;
    uStack_e0 = uStack_220;
    local_d8 = local_218;
    uStack_d0 = uStack_210;
    local_2a8 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    alloc.talloc1 = (ThreadLocal *)0x0;
    alloc.alloc = (FastAllocator *)0x0;
    alloc.talloc0 = (ThreadLocal *)0x0;
    local_290.this = this;
    local_1e0.scene = local_288.scene;
    local_1e0.unalignedHeuristic.scene = local_288.scene;
    local_1e0.temporalSplitHeuristic.recalculatePrimRef.scene = local_288.scene;
    local_a8 = &local_2e8;
    BVHBuilderHairMSMBlur::
    BuilderT<embree::NodeRefPtr<4>,_embree::sse2::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair_mb.cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
    ::recurse(&local_98,&local_1e0,(BuildRecord *)&local_148.field_1,alloc,true);
    BVHN<4>::set(this->bvh,(NodeRef)local_98.ref.ptr,&local_98.lbounds,local_208);
    BVHN<4>::cleanup(this->bvh,(EVP_PKEY_CTX *)local_98.ref.ptr);
    BVHN<4>::postBuild(this->bvh,local_2c0);
    sVar8 = local_2e8.size_alloced;
    if (local_2e8.items != (PrimRefMB *)0x0) {
      if (local_2e8.size_alloced * 0x50 < 0x1c00000) {
        alignedFree(local_2e8.items);
      }
      else {
        os_free(local_2e8.items,local_2e8.size_alloced * 0x50,local_2e8.alloc.hugepages);
      }
    }
    if (sVar8 != 0) {
      (**(local_2e8.alloc.device)->_vptr_MemoryMonitorInterface)
                (local_2e8.alloc.device,sVar8 * -0x50,1);
    }
  }
  return;
}

Assistant:

void build() 
      {
        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,true);
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairMBlurBuilderSAH");

        //profile(1,5,numPrimitives,[&] (ProfileTimer& timer) {

        /* create primref array */
        mvector<PrimRefMB> prims0(scene->device,numPrimitives);
        const PrimInfoMB pinfo = createPrimRefArrayMSMBlur(scene,Geometry::MTY_CURVES,numPrimitives,prims0,bvh->scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(typename BVH::AABBNodeMB)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.num_time_segments);
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
    
        /* settings for BVH build */
        BVHBuilderHairMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();

        /* creates a leaf node */
        auto createLeaf = [&] (const SetMB& prims, const FastAllocator::CachedAllocator& alloc) -> NodeRecordMB4D {

          if (prims.size() == 0)
            return NodeRecordMB4D(BVH::emptyNode,empty,empty);
          
          const unsigned int geomID0 = (*prims.prims)[prims.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeafMB(bvh,prims,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeafMB(bvh,prims,alloc);
          else
            return CurvePrimitive::createLeafMB(bvh,prims,alloc);
        };

        /* build the hierarchy */
        auto root = BVHBuilderHairMSMBlur::build<NodeRef>
          (scene, prims0, pinfo,
           VirtualRecalculatePrimRef(scene),
           typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNodeMB4D::Create(),
           typename BVH::AABBNodeMB4D::Set(),
           typename BVH::OBBNodeMB::Create(),
           typename BVH::OBBNodeMB::Set(),
           createLeaf,
           bvh->scene->progressInterface,
           settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
        
        //});
        
        /* clear temporary data for static geometry */
        bvh->cleanup();
        bvh->postBuild(t0);
      }